

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2Recursion(void)

{
  char *in_RSI;
  
  TestRecursion(0x14f213,in_RSI);
  TestRecursion(0x14973e,in_RSI);
  TestRecursion(0x14d5f1,in_RSI);
  TestRecursion(0x14d5f4,in_RSI);
  TestRecursion(0x14d5f8,in_RSI);
  return;
}

Assistant:

TEST(RE2, Recursion) {
  // Test that recursion is stopped.
  // This test is PCRE-legacy -- there's no recursion in RE2.
  int bytes = 15 * 1024;  // enough to crash PCRE
  TestRecursion(bytes, ".");
  TestRecursion(bytes, "a");
  TestRecursion(bytes, "a.");
  TestRecursion(bytes, "ab.");
  TestRecursion(bytes, "abc.");
}